

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

int prvTidyGetCharEncodingFromOptName(ctmbstr charenc)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0x10;
  do {
    iVar1 = prvTidytmbstrcasecmp(charenc,*(ctmbstr *)((long)&enc2iana[0].id + lVar2));
    if (iVar1 == 0) {
      return *(int *)((long)&defaultVtbl.free + lVar2);
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x160);
  return -1;
}

Assistant:

int TY_(GetCharEncodingFromOptName)( ctmbstr charenc )
{
    uint i;

    for (i = 0; i < sizeof(enc2iana)/sizeof(enc2iana[0]); ++i)
        if (TY_(tmbstrcasecmp)(charenc, enc2iana[i].tidyOptName) == 0 )
            return enc2iana[i].id;

    return -1;
}